

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O3

int __thiscall Configurator::configure(Configurator *this,string *hmhome)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (hmhome->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + hmhome->_M_string_length);
  configure_home_path(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  print_configuaration(this);
  return 0;
}

Assistant:

int configure(const std::string hmhome) {
    configure_home_path(hmhome);
    print_configuaration();
    return 0;
  }